

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall
cmCTest::RunTest(cmCTest *this,vector<const_char_*,_std::allocator<const_char_*>_> *argv,
                string *output,int *retVal,ostream *log,cmDuration testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment,Encoding encoding)

{
  pointer *out;
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer pPVar4;
  ostream *poVar5;
  char *pcVar6;
  reference ppcVar7;
  string *file2;
  pointer pPVar8;
  reference ppcVar9;
  cmsysProcess *cp_00;
  char **command;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  void *pvVar13;
  rep_conflict timeout_00;
  bool local_1409;
  bool local_1321;
  byte local_130a;
  bool local_12b1;
  bool local_12a1;
  byte local_1289;
  string local_1288 [32];
  undefined1 local_1268 [8];
  ostringstream cmCTestLog_msg_7;
  allocator<char> local_10e9;
  string local_10e8 [8];
  string outerr_1;
  undefined1 local_10a8 [8];
  ostringstream cmCTestLog_msg_6;
  allocator<char> local_f29;
  string local_f28 [8];
  string outerr;
  string local_f00 [4];
  int result;
  undefined1 local_ee0 [8];
  ostringstream cmCTestLog_msg_5;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_d68;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_d60;
  vector<char,_std::allocator<char>_> local_d58;
  string local_d40 [32];
  cmCTestLogWrite local_d20;
  undefined1 local_d10 [8];
  ostringstream cmCTestLog_msg_4;
  string local_b98;
  string local_b78 [32];
  cmCTestLogWrite local_b58;
  undefined1 local_b48 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_9d0 [8];
  string strdata;
  cmProcessOutput processOutput;
  char *pcStack_9a8;
  int length;
  char *data;
  undefined1 local_980 [8];
  ostringstream cmCTestLog_msg_2;
  cmsysProcess *cp;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  local_7f8;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  saveEnv;
  vector<char,_std::allocator<char>_> tempOutput;
  undefined1 local_7b8 [8];
  ostringstream cmCTestLog_msg_1;
  string local_640 [32];
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  local_620;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  local_618;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  saveEnv_1;
  ostringstream local_5f0 [8];
  ostringstream msg;
  duration<double,_std::ratio<1L,_1L>_> local_478;
  duration<double,_std::ratio<1L,_1L>_> local_470;
  char *local_468;
  char *i;
  iterator __end2;
  iterator __begin2;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostringstream oss;
  cmCTest local_2b8;
  cmCTest inst;
  string local_2a8;
  string local_288 [38];
  byte local_262;
  allocator<char> local_261;
  duration<double,_std::ratio<1L,_1L>_> local_260;
  string local_258;
  ostringstream local_228 [8];
  ostringstream cmCTestLog_msg;
  int local_ac;
  duration<long,_std::ratio<1L,_1L>_> local_a8;
  cmCTest *local_a0;
  duration<double,_std::ratio<1L,_1L>_> local_98;
  duration<double,_std::ratio<1L,_1L>_> local_90;
  duration<double,_std::ratio<1L,_1L>_> local_88;
  duration<double,_std::ratio<1L,_1L>_> local_80;
  int local_74;
  duration<long,_std::ratio<60L,_1L>_> local_70;
  duration<double,_std::ratio<1L,_1L>_> local_68;
  duration<double,_std::ratio<1L,_1L>_> local_60;
  duration<double,_std::ratio<1L,_1L>_> local_58;
  cmDuration timeout;
  bool modifyEnv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *environment_local;
  ostream *log_local;
  int *retVal_local;
  string *output_local;
  vector<const_char_*,_std::allocator<const_char_*>_> *argv_local;
  cmCTest *this_local;
  cmDuration testTimeOut_local;
  
  local_1289 = 0;
  this_local = (cmCTest *)testTimeOut.__r;
  if (environment !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(environment);
    local_1289 = bVar1 ^ 0xff;
  }
  timeout.__r._7_1_ = local_1289 & 1;
  local_58.__r = (rep_conflict)GetRemainingTimeAllowed(this);
  local_60.__r = (rep_conflict)MaxDuration();
  bVar1 = std::chrono::operator!=(&local_58,&local_60);
  if (bVar1) {
    local_74 = 2;
    std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
              ((duration<long,std::ratio<60l,1l>> *)&local_70,&local_74);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<60l,1l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_68,&local_70);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator-=(&local_58,&local_68);
  }
  pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  local_80 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar1 = std::chrono::operator>(&pPVar4->TimeOut,&local_80);
  local_12a1 = false;
  if (bVar1) {
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    local_12a1 = std::chrono::operator<(&pPVar4->TimeOut,&local_58);
  }
  if (local_12a1 != false) {
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    local_58.__r = (pPVar4->TimeOut).__r;
  }
  local_88 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar1 = std::chrono::operator>((duration<double,_std::ratio<1L,_1L>_> *)&this_local,&local_88);
  local_12b1 = false;
  if (bVar1) {
    local_90.__r = (rep_conflict)GetRemainingTimeAllowed(this);
    local_12b1 = std::chrono::operator<
                           ((duration<double,_std::ratio<1L,_1L>_> *)&this_local,&local_90);
  }
  if (local_12b1 != false) {
    local_58.__r = (rep_conflict)this_local;
  }
  local_98 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar1 = std::chrono::operator<=(&local_58,&local_98);
  if (bVar1) {
    local_ac = 1;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_a8,&local_ac);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_a0,&local_a8);
    local_58.__r = (rep_conflict)local_a0;
  }
  std::__cxx11::ostringstream::ostringstream(local_228);
  poVar5 = std::operator<<((ostream *)local_228,"Test timeout computed to be: ");
  local_262 = 0;
  local_260.__r = (rep_conflict)MaxDuration();
  bVar1 = std::chrono::operator==(&local_58,&local_260);
  if (bVar1) {
    std::allocator<char>::allocator();
    local_262 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"infinite",&local_261);
  }
  else {
    uVar2 = cmDurationTo<unsigned_int>(&local_58);
    std::__cxx11::to_string(&local_258,uVar2);
  }
  poVar5 = std::operator<<(poVar5,(string *)&local_258);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)&local_258);
  if ((local_262 & 1) != 0) {
    std::allocator<char>::~allocator(&local_261);
  }
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  Log(this,5,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
      ,0x4b3,pcVar6,false);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::ostringstream::~ostringstream(local_228);
  ppcVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](argv,0);
  pcVar6 = *ppcVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,pcVar6,
             (allocator<char> *)
             ((long)&inst.Impl._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false> + 7));
  file2 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar1 = cmsys::SystemTools::SameFile(&local_2a8,file2);
  local_130a = 0;
  if (bVar1) {
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    local_130a = pPVar4->ForceNewCTestProcess ^ 0xff;
  }
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&inst.Impl._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false> + 7));
  if ((local_130a & 1) == 0) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&saveEnv);
    if (output != (string *)0x0) {
      std::__cxx11::string::clear();
    }
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,std::default_delete<cmSystemTools::SaveRestoreEnvironment>>
    ::unique_ptr<std::default_delete<cmSystemTools::SaveRestoreEnvironment>,void>
              ((unique_ptr<cmSystemTools::SaveRestoreEnvironment,std::default_delete<cmSystemTools::SaveRestoreEnvironment>>
                *)&local_7f8);
    if ((timeout.__r._7_1_ & 1) != 0) {
      std::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::operator=(&local_7f8,
                  (unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                   *)&cp);
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                     *)&cp);
      cmSystemTools::AppendEnv(environment);
    }
    cp_00 = cmsysProcess_New();
    command = std::vector<const_char_*,_std::allocator<const_char_*>_>::data(argv);
    cmsysProcess_SetCommand(cp_00,command);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_980);
    poVar5 = std::operator<<((ostream *)local_980,"Command is: ");
    ppcVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](argv,0);
    poVar5 = std::operator<<(poVar5,*ppcVar7);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
        ,0x4f6,pcVar6,false);
    std::__cxx11::string::~string((string *)&data);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_980);
    bVar1 = cmSystemTools::GetRunCommandHideConsole();
    if (bVar1) {
      cmsysProcess_SetOption(cp_00,0,1);
    }
    timeout_00 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_58);
    cmsysProcess_SetTimeout(cp_00,timeout_00);
    cmsysProcess_Execute(cp_00);
    cmProcessOutput::cmProcessOutput
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),encoding,0x400);
    std::__cxx11::string::string((string *)local_9d0);
    while (iVar3 = cmsysProcess_WaitForData
                             (cp_00,&stack0xfffffffffffff658,
                              (int *)(strdata.field_2._M_local_buf + 0xc),(double *)0x0), iVar3 != 0
          ) {
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_9a8,
                 (long)(int)strdata.field_2._12_4_,(string *)local_9d0,0);
      if (output != (string *)0x0) {
        cmAppend<char,char*>
                  ((vector<char,_std::allocator<char>_> *)&saveEnv,pcStack_9a8,
                   pcStack_9a8 + (int)strdata.field_2._12_4_);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b48);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      sVar10 = std::__cxx11::string::size();
      cmCTestLogWrite::cmCTestLogWrite(&local_b58,pcVar6,sVar10);
      ::operator<<((ostream *)local_b48,&local_b58);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
          ,0x508,pcVar6,false);
      std::__cxx11::string::~string(local_b78);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b48);
      if (log != (ostream *)0x0) {
        lVar11 = std::__cxx11::string::c_str();
        std::__cxx11::string::size();
        std::ostream::write((char *)log,lVar11);
      }
    }
    std::__cxx11::string::string((string *)&local_b98);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_b98,
               (string *)local_9d0,0);
    std::__cxx11::string::~string((string *)&local_b98);
    uVar12 = std::__cxx11::string::empty();
    if ((uVar12 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d10);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      sVar10 = std::__cxx11::string::size();
      cmCTestLogWrite::cmCTestLogWrite(&local_d20,pcVar6,sVar10);
      ::operator<<((ostream *)local_d10,&local_d20);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
          ,0x510,pcVar6,false);
      std::__cxx11::string::~string(local_d40);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d10);
      if (log != (ostream *)0x0) {
        lVar11 = std::__cxx11::string::c_str();
        std::__cxx11::string::size();
        std::ostream::write((char *)log,lVar11);
      }
    }
    cmsysProcess_WaitForExit(cp_00,(double *)0x0);
    std::vector<char,_std::allocator<char>_>::vector
              (&local_d58,(vector<char,_std::allocator<char>_> *)&saveEnv);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_d58,
               (vector<char,_std::allocator<char>_> *)&saveEnv,0);
    std::vector<char,_std::allocator<char>_>::~vector(&local_d58);
    local_1409 = false;
    if (output != (string *)0x0) {
      local_d60._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)&saveEnv);
      local_d68._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::end
                             ((vector<char,_std::allocator<char>_> *)&saveEnv);
      local_1409 = __gnu_cxx::operator!=(&local_d60,&local_d68);
    }
    if (local_1409 != false) {
      pcVar6 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)&saveEnv);
      std::vector<char,_std::allocator<char>_>::size
                ((vector<char,_std::allocator<char>_> *)&saveEnv);
      std::__cxx11::string::append((char *)output,(ulong)pcVar6);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ee0);
    poVar5 = std::operator<<((ostream *)local_ee0,"-- Process completed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
        ,0x51c,pcVar6,false);
    std::__cxx11::string::~string(local_f00);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ee0);
    outerr.field_2._12_4_ = cmsysProcess_GetState(cp_00);
    if (outerr.field_2._12_4_ == 4) {
      iVar3 = cmsysProcess_GetExitValue(cp_00);
      *retVal = iVar3;
      if ((*retVal != 0) &&
         (pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl), (pPVar4->OutputTestOutputOnTestFailure & 1U) != 0)) {
        OutputTestErrors(this,(vector<char,_std::allocator<char>_> *)&saveEnv);
      }
    }
    else if (outerr.field_2._12_4_ == 2) {
      pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      if ((pPVar4->OutputTestOutputOnTestFailure & 1U) != 0) {
        OutputTestErrors(this,(vector<char,_std::allocator<char>_> *)&saveEnv);
      }
      iVar3 = cmsysProcess_GetExitException(cp_00);
      *retVal = iVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_f28,"\n*** Exception executing: ",&local_f29);
      std::allocator<char>::~allocator(&local_f29);
      pcVar6 = cmsysProcess_GetExceptionString(cp_00);
      std::__cxx11::string::operator+=(local_f28,pcVar6);
      if (output != (string *)0x0) {
        std::__cxx11::string::operator+=((string *)output,local_f28);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_10a8);
      poVar5 = std::operator<<((ostream *)local_10a8,local_f28);
      pvVar13 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar13,std::flush<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
          ,0x531,pcVar6,false);
      std::__cxx11::string::~string((string *)(outerr_1.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_10a8);
      std::__cxx11::string::~string(local_f28);
    }
    else if (outerr.field_2._12_4_ == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_10e8,"\n*** ERROR executing: ",&local_10e9);
      std::allocator<char>::~allocator(&local_10e9);
      pcVar6 = cmsysProcess_GetErrorString(cp_00);
      std::__cxx11::string::operator+=(local_10e8,pcVar6);
      if (output != (string *)0x0) {
        std::__cxx11::string::operator+=((string *)output,local_10e8);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1268);
      poVar5 = std::operator<<((ostream *)local_1268,local_10e8);
      pvVar13 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar13,std::flush<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
          ,0x53a,pcVar6,false);
      std::__cxx11::string::~string(local_1288);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1268);
      std::__cxx11::string::~string(local_10e8);
    }
    cmsysProcess_Delete(cp_00);
    testTimeOut_local.__r._4_4_ = outerr.field_2._12_4_;
    std::__cxx11::string::~string((string *)local_9d0);
    cmProcessOutput::~cmProcessOutput((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb));
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr(&local_7f8);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)&saveEnv);
  }
  else {
    cmCTest(&local_2b8);
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    pPVar8 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&local_2b8.Impl);
    std::__cxx11::string::operator=((string *)&pPVar8->ConfigType,(string *)&pPVar4->ConfigType);
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&local_2b8.Impl);
    (pPVar4->TimeOut).__r = local_58.__r;
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)
               &args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    out = &args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    SetStreams(&local_2b8,(ostream *)out,(ostream *)out);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
    __end2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(argv);
    i = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(argv);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                       *)&i), bVar1) {
      ppcVar9 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&__end2);
      local_468 = *ppcVar9;
      if (local_468 != (char *)0x0) {
        iVar3 = strcmp(local_468,"--build-generator");
        local_1321 = false;
        if (iVar3 == 0) {
          local_470.__r = (rep_conflict)MaxDuration();
          bVar1 = std::chrono::operator!=(&local_58,&local_470);
          local_1321 = false;
          if (bVar1) {
            local_478 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
            local_1321 = std::chrono::operator>(&local_58,&local_478);
          }
        }
        if (local_1321 != false) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[15]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
                     (char (*) [15])"--test-timeout");
          std::__cxx11::ostringstream::ostringstream(local_5f0);
          uVar2 = cmDurationTo<unsigned_int>(&local_58);
          std::ostream::operator<<(local_5f0,uVar2);
          std::__cxx11::ostringstream::str();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2,(value_type *)&saveEnv_1);
          std::__cxx11::string::~string((string *)&saveEnv_1);
          std::__cxx11::ostringstream::~ostringstream(local_5f0);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
                   &local_468);
      }
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&__end2);
    }
    if (log != (ostream *)0x0) {
      poVar5 = std::operator<<(log,"* Run internal CTest");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,std::default_delete<cmSystemTools::SaveRestoreEnvironment>>
    ::unique_ptr<std::default_delete<cmSystemTools::SaveRestoreEnvironment>,void>
              ((unique_ptr<cmSystemTools::SaveRestoreEnvironment,std::default_delete<cmSystemTools::SaveRestoreEnvironment>>
                *)&local_618);
    if ((timeout.__r._7_1_ & 1) != 0) {
      std::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::operator=(&local_618,&local_620);
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr(&local_620);
      cmSystemTools::AppendEnv(environment);
    }
    iVar3 = Run(&local_2b8,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2,output);
    *retVal = iVar3;
    if (output != (string *)0x0) {
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=((string *)output,local_640);
      std::__cxx11::string::~string(local_640);
    }
    if ((log != (ostream *)0x0) && (output != (string *)0x0)) {
      std::operator<<(log,(string *)output);
    }
    if (output != (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7b8);
      poVar5 = std::operator<<((ostream *)local_7b8,"Internal cmCTest object used to run test.");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,(string *)output);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
          ,0x4e4,pcVar6,false);
      std::__cxx11::string::~string
                ((string *)
                 &tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7b8);
    }
    testTimeOut_local.__r._4_4_ = 4;
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr(&local_618);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)
               &args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ~cmCTest(&local_2b8);
  }
  return testTimeOut_local.__r._4_4_;
}

Assistant:

int cmCTest::RunTest(std::vector<const char*> argv, std::string* output,
                     int* retVal, std::ostream* log, cmDuration testTimeOut,
                     std::vector<std::string>* environment, Encoding encoding)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  cmDuration timeout = this->GetRemainingTimeAllowed();
  if (timeout != cmCTest::MaxDuration()) {
    timeout -= std::chrono::minutes(2);
  }
  if (this->Impl->TimeOut > cmDuration::zero() &&
      this->Impl->TimeOut < timeout) {
    timeout = this->Impl->TimeOut;
  }
  if (testTimeOut > cmDuration::zero() &&
      testTimeOut < this->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }

  // always have at least 1 second if we got to here
  if (timeout <= cmDuration::zero()) {
    timeout = std::chrono::seconds(1);
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: "
               << (timeout == cmCTest::MaxDuration()
                     ? std::string("infinite")
                     : std::to_string(cmDurationTo<unsigned int>(timeout)))
               << "\n");
  if (cmSystemTools::SameFile(argv[0], cmSystemTools::GetCTestCommand()) &&
      !this->Impl->ForceNewCTestProcess) {
    cmCTest inst;
    inst.Impl->ConfigType = this->Impl->ConfigType;
    inst.Impl->TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for (char const* i : argv) {
      if (i) {
        // make sure we pass the timeout in for any build and test
        // invocations. Since --build-generator is required this is a
        // good place to check for it, and to add the arguments in
        if (strcmp(i, "--build-generator") == 0 &&
            timeout != cmCTest::MaxDuration() &&
            timeout > cmDuration::zero()) {
          args.emplace_back("--test-timeout");
          std::ostringstream msg;
          msg << cmDurationTo<unsigned int>(timeout);
          args.push_back(msg.str());
        }
        args.emplace_back(i);
      }
    }
    if (log) {
      *log << "* Run internal CTest" << std::endl;
    }

    std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv) {
      saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      cmSystemTools::AppendEnv(*environment);
    }

    *retVal = inst.Run(args, output);
    if (output) {
      *output += oss.str();
    }
    if (log && output) {
      *log << *output;
    }
    if (output) {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                                                             << *output
                                                             << std::endl);
    }

    return cmsysProcess_State_Exited;
  }
  std::vector<char> tempOutput;
  if (output) {
    output->clear();
  }

  std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv) {
    saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
    cmSystemTools::AppendEnv(*environment);
  }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while (cmsysProcess_WaitForData(cp, &data, &length, nullptr)) {
    processOutput.DecodeText(data, length, strdata);
    if (output) {
      cmAppend(tempOutput, data, data + length);
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }

  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(tempOutput, tempOutput);
  if (output && tempOutput.begin() != tempOutput.end()) {
    output->append(tempOutput.data(), tempOutput.size());
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "-- Process completed" << std::endl);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    if (*retVal != 0 && this->Impl->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (this->Impl->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
    *retVal = cmsysProcess_GetExitException(cp);
    std::string outerr = "\n*** Exception executing: ";
    outerr += cmsysProcess_GetExceptionString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               outerr << std::endl
                      << std::flush);
  } else if (result == cmsysProcess_State_Error) {
    std::string outerr = "\n*** ERROR executing: ";
    outerr += cmsysProcess_GetErrorString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               outerr << std::endl
                      << std::flush);
  }
  cmsysProcess_Delete(cp);

  return result;
}